

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferTests.cpp
# Opt level: O3

void __thiscall
vkt::sparse::anon_unknown_0::SparseAllocationBuilder::SparseAllocationBuilder
          (SparseAllocationBuilder *this)

{
  uint in_EAX;
  undefined8 uStack_28;
  
  this->m_allocationNdx = 0;
  this->m_resourceChunkNdx = 0;
  this->m_memoryChunkNdx = 0;
  (this->m_memoryBinds).
  super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_memoryBinds).
  super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_memoryBinds).
  super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_chunksPerAllocation).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_chunksPerAllocation).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_chunksPerAllocation).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_28 = (ulong)in_EAX;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
            (&this->m_chunksPerAllocation,(iterator)0x0,(uint *)((long)&uStack_28 + 4));
  return;
}

Assistant:

SparseAllocationBuilder::SparseAllocationBuilder (void)
	: m_allocationNdx		(0)
	, m_resourceChunkNdx	(0)
	, m_memoryChunkNdx		(0)
{
	m_chunksPerAllocation.push_back(0);
}